

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O3

void __thiscall Balk::solve_balk(Balk *this)

{
  pointer psVar1;
  element_type *peVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer psVar5;
  shared_ptr<Term> *el;
  long lVar6;
  iterator __position;
  shared_ptr<Term> last;
  shared_ptr<Term> first;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  vector<double,_std::allocator<double>_> local_58;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  psVar5 = (this->terms).
           super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->terms).
           super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_38 = (element_type *)0x0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68 = (element_type *)0x0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (psVar5 != psVar1) {
    lVar6 = -(long)psVar5;
    do {
      peVar2 = (psVar5->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar2->shift == 0) && (peVar2->initial_variable != true)) {
        local_38 = peVar2;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (a_Stack_30,
                   &(psVar5->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
        if (local_38 != (element_type *)0x0) {
          (*local_38->_vptr_Term[3])(local_38,this);
          std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::_M_erase
                    (&this->terms,(shared_ptr<Term> *)-lVar6);
          goto LAB_00104062;
        }
        break;
      }
      psVar5 = psVar5 + 1;
      lVar6 = lVar6 + -0x10;
    } while (psVar5 != psVar1);
  }
  func(this,2,0.0);
  func(this,3,0.0);
LAB_00104062:
  psVar5 = (this->terms).
           super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->terms).
           super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  __position._M_current = psVar5;
  if (psVar5 != psVar1) {
    do {
      peVar2 = (psVar5->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar2->shift == this->balk_size) && (peVar2->initial_variable == false)) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&_Stack_60,
                   &(psVar5->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
        __position._M_current = psVar5;
        local_68 = peVar2;
        break;
      }
      psVar5 = psVar5 + 1;
      __position._M_current = psVar1;
    } while (psVar5 != psVar1);
  }
  if (local_68 == (element_type *)0x0) {
    func(this,2,(double)this->balk_size * this->segment_length);
    func(this,3,(double)this->balk_size * this->segment_length);
  }
  else {
    (*local_68->_vptr_Term[3])(local_68,this);
    std::vector<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>::_M_erase
              (&this->terms,__position);
  }
  psVar1 = (this->terms).
           super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (psVar5 = (this->terms).
                super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
                _M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1) {
    peVar2 = (psVar5->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar2->is_unknown == true) {
      (*peVar2->_vptr_Term[3])(peVar2,this);
    }
  }
  lu::solve(&local_58,&this->A,&this->b);
  pdVar3 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (this->x).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((pdVar3 != (pointer)0x0) &&
     (operator_delete(pdVar3,(long)pdVar4 - (long)pdVar3),
     local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start != (pointer)0x0)) {
    operator_delete(local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
  }
  if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
  }
  return;
}

Assistant:

void Balk::solve_balk()
{
    // Count a number of unknown elements. Init with 4 because of initial variables.
    size_t unknown_num = 4;
    for (const auto &el : terms)
    {
        unknown_num += ((el->isUnknown()) && (el->getShift() != 0) && (el->getShift() != balk_size));
    }

    std::shared_ptr<Term> first = nullptr;
    std::shared_ptr<Term> last = nullptr;
    auto it = terms.begin();
    for (; it != terms.end(); ++it)
    {
        if ((it->get()->getShift() == 0) && !(it->get()->initial_variable))
        {
            first = *it;
            break;
        }
    }
    if (first == nullptr)
    { // Free begin
        func(2, 0);
        func(3, 0);
    }
    else
    {
        first->addAnEquation(*this);
        terms.erase(it);
    }

    it = terms.begin();
    for (; it != terms.end(); ++it)
    {
        if ((it->get()->getShift() == balk_size) && !(it->get()->initial_variable))
        {
            last = *it;
            break;
        }
    }
    if (last == nullptr)
    { // Free end
        func(2, segment_length * balk_size);
        func(3, segment_length * balk_size);
    }
    else
    {
        last->addAnEquation(*this);
        terms.erase(it);
    }

    for (const auto &el : terms)
    {
        if (el->isUnknown())
        {
            el->addAnEquation(*this);
        }
    }

    x = lu::solve(A, b);
}